

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

void __thiscall SparseMatrix::~SparseMatrix(SparseMatrix *this)

{
  if (this->own_data == true) {
    if (this->score_rows != (int *)0x0) {
      operator_delete__(this->score_rows);
    }
    if (this->csr_row_ptr != (int *)0x0) {
      operator_delete__(this->csr_row_ptr);
    }
    if (this->csr_col_idx != (int *)0x0) {
      operator_delete__(this->csr_col_idx);
    }
    if (this->ccs_row_idx != (int *)0x0) {
      operator_delete__(this->ccs_row_idx);
    }
    if (this->ccs_col_ptr != (int *)0x0) {
      operator_delete__(this->ccs_col_ptr);
    }
    if (this->ccs_rating_scores != (value_type_conflict1 *)0x0) {
      operator_delete__(this->ccs_rating_scores);
      return;
    }
  }
  return;
}

Assistant:

~SparseMatrix(){

        if(own_data) {

            delete[] score_rows;
            delete[] csr_row_ptr;
            delete[] csr_col_idx;
            delete[] ccs_row_idx;
            delete[] ccs_col_ptr;
            delete[] ccs_rating_scores;

        }
    }